

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine_test.cpp
# Opt level: O0

void __thiscall
Engine_testConstructWithHandler_Test::TestBody(Engine_testConstructWithHandler_Test *this)

{
  bool bVar1;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *pvVar2;
  pointer pHVar3;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *this_00;
  vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
  *this_01;
  void **val1;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  Engine e1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Engine e;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *in_stack_fffffffffffffd78;
  unique_ptr<Handler,_std::default_delete<Handler>_> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  int iVar4;
  unique_ptr<Handler,_std::default_delete<Handler>_> *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  Type in_stack_fffffffffffffd9c;
  Type type;
  Engine *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  char *in_stack_fffffffffffffdb8;
  Engine *in_stack_fffffffffffffdc0;
  allocator *paVar5;
  undefined8 local_228;
  Message *in_stack_fffffffffffffde8;
  AssertHelper *in_stack_fffffffffffffdf0;
  AssertionResult local_1b8 [2];
  size_type local_198;
  undefined4 local_18c;
  AssertionResult local_188 [2];
  AssertionResult local_168 [2];
  allocator local_141;
  string local_140 [32];
  Engine local_120;
  undefined8 local_d8;
  undefined8 local_d0;
  AssertionResult local_c8 [2];
  size_type local_a8;
  undefined4 local_9c;
  AssertionResult local_98;
  uint local_84;
  AssertionResult local_70 [3];
  Engine local_40;
  
  std::make_unique<TestHandler>();
  std::unique_ptr<Handler,std::default_delete<Handler>>::
  unique_ptr<TestHandler,std::default_delete<TestHandler>,void>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  Engine::Engine(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (unique_ptr<Handler,_std::default_delete<Handler>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr(in_stack_fffffffffffffd80);
  std::unique_ptr<TestHandler,_std::default_delete<TestHandler>_>::~unique_ptr
            ((unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
             CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
             (char (*) [4])in_stack_fffffffffffffd78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0);
    testing::AssertionResult::failure_message((AssertionResult *)0x11586e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
               (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
               (char *)in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    testing::Message::~Message((Message *)0x1158d1);
  }
  local_84 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11593f);
  if (local_84 == 0) {
    local_9c = 1;
    pvVar2 = Engine::GetHandlers(&local_40);
    local_a8 = std::
               vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
               ::size(pvVar2);
    testing::internal::EqHelper<false>::Compare<int,unsigned_long>
              (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
               (int *)in_stack_fffffffffffffd78,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffda0);
      in_stack_fffffffffffffdf0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x115a23);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                 (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                 (char *)in_stack_fffffffffffffd80);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      testing::Message::~Message((Message *)0x115a86);
    }
    local_84 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x115af4);
    if (local_84 == 0) {
      local_d0 = 0;
      pvVar2 = Engine::GetHandlers(&local_40);
      std::
      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
      ::operator[](pvVar2,0);
      pHVar3 = std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                         ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                          CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      if (pHVar3 == (pointer)0x0) {
        local_228 = 0;
      }
      else {
        local_228 = __dynamic_cast(pHVar3,&Handler::typeinfo,&TestHandler::typeinfo,0);
      }
      local_d8 = local_228;
      testing::internal::CmpHelperNE<decltype(nullptr),TestHandler*>
                (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
                 (void **)in_stack_fffffffffffffd78,
                 (TestHandler **)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffda0);
        testing::AssertionResult::failure_message((AssertionResult *)0x115c1b);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                   (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20)
                   ,(char *)in_stack_fffffffffffffd80);
        testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdf0,(Message *)pvVar2);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
        testing::Message::~Message((Message *)0x115c78);
      }
      local_84 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x115ce6);
      if (local_84 == 0) {
        paVar5 = &local_141;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_140,"foo",paVar5);
        std::make_unique<TestHandler>();
        std::unique_ptr<Handler,std::default_delete<Handler>>::
        unique_ptr<TestHandler,std::default_delete<TestHandler>,void>
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        Engine::Engine(in_stack_fffffffffffffda0,
                       (string *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                       in_stack_fffffffffffffd90);
        std::unique_ptr<Handler,_std::default_delete<Handler>_>::~unique_ptr
                  (in_stack_fffffffffffffd80);
        std::unique_ptr<TestHandler,_std::default_delete<TestHandler>_>::~unique_ptr
                  ((unique_ptr<TestHandler,_std::default_delete<TestHandler>_> *)
                   CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
        std::__cxx11::string::~string(local_140);
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
        testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
                  (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
                   (char (*) [4])in_stack_fffffffffffffd78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffda0);
          testing::AssertionResult::failure_message((AssertionResult *)0x115ec7);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
                     (char *)in_stack_fffffffffffffd90,
                     (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                     (char *)in_stack_fffffffffffffd80);
          testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdf0,(Message *)pvVar2);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
          testing::Message::~Message((Message *)0x115f24);
        }
        local_84 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x115f92);
        if (local_84 == 0) {
          local_18c = 1;
          this_00 = Engine::GetHandlers(&local_120);
          local_198 = std::
                      vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
                      ::size(this_00);
          testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                    (in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80,
                     (int *)in_stack_fffffffffffffd78,
                     (unsigned_long *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70))
          ;
          iVar4 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_188);
          type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd9c);
          if (!bVar1) {
            testing::Message::Message((Message *)this_00);
            in_stack_fffffffffffffd90 =
                 (unique_ptr<Handler,_std::default_delete<Handler>_> *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x11606a);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)this_00,type,(char *)in_stack_fffffffffffffd90,iVar4,
                       (char *)in_stack_fffffffffffffd80);
            testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdf0,(Message *)pvVar2);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70)
                      );
            testing::Message::~Message((Message *)0x1160c7);
          }
          local_84 = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x116135);
          if (local_84 == 0) {
            this_01 = Engine::GetHandlers(&local_120);
            std::
            vector<std::unique_ptr<Handler,_std::default_delete<Handler>_>,_std::allocator<std::unique_ptr<Handler,_std::default_delete<Handler>_>_>_>
            ::operator[](this_01,0);
            pHVar3 = std::unique_ptr<Handler,_std::default_delete<Handler>_>::get
                               ((unique_ptr<Handler,_std::default_delete<Handler>_> *)
                                CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
            if (pHVar3 == (pointer)0x0) {
              val1 = (void **)0x0;
            }
            else {
              val1 = (void **)__dynamic_cast(pHVar3,&Handler::typeinfo,&TestHandler::typeinfo,0);
            }
            testing::internal::CmpHelperNE<decltype(nullptr),TestHandler*>
                      ((char *)this_01,(char *)pHVar3,val1,
                       (TestHandler **)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70)
                      );
            iVar4 = (int)((ulong)this_01 >> 0x20);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1b8);
            in_stack_fffffffffffffd77 = bVar1;
            if (!bVar1) {
              testing::Message::Message((Message *)this_00);
              testing::AssertionResult::failure_message((AssertionResult *)0x116256);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)this_00,type,(char *)in_stack_fffffffffffffd90,iVar4,
                         (char *)pHVar3);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffdf0,(Message *)pvVar2);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
              testing::Message::~Message((Message *)0x1162b1);
            }
            local_84 = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x11631c);
            if (local_84 == 0) {
              local_84 = 0;
            }
          }
        }
        Engine::~Engine((Engine *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
      }
    }
  }
  Engine::~Engine((Engine *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  return;
}

Assistant:

TEST(Engine, testConstructWithHandler) {
    Engine e("foo", std::move(std::make_unique<TestHandler>()));
    ASSERT_EQ("foo", e.prefix);
    ASSERT_EQ(1, e.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<TestHandler *>(e.GetHandlers()[0].get()));
    Engine e1(std::string("foo"), std::move(std::make_unique<TestHandler>()));
    ASSERT_EQ("foo", e1.prefix);
    ASSERT_EQ(1, e1.GetHandlers().size());
    ASSERT_NE(nullptr, dynamic_cast<TestHandler *>(e1.GetHandlers()[0].get()));
}